

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatScaleAddI_Dense(sunrealtype c,SUNMatrix A)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  plVar1 = (long *)A->content;
  lVar3 = plVar1[1];
  if (plVar1[1] < 1) {
    lVar3 = 0;
  }
  for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    lVar5 = *plVar1;
    if (*plVar1 < 1) {
      lVar5 = 0;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      lVar2 = *(long *)(plVar1[4] + lVar4 * 8);
      dVar7 = *(double *)(lVar2 + lVar6 * 8) * c;
      dVar8 = dVar7 + 1.0;
      if (lVar4 != lVar6) {
        dVar8 = dVar7;
      }
      *(double *)(lVar2 + lVar6 * 8) = dVar8;
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Dense(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation A = c*A + I */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(A, i, j) *= c;
      if (i == j) { SM_ELEMENT_D(A, i, j) += ONE; }
    }
  }

  return SUN_SUCCESS;
}